

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

Ga2_Man_t * Ga2_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Ga2_Man_t *pGVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  void *pvVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  int *piVar11;
  Vec_Int_t *p;
  Rnm_Man_t *pRVar12;
  uint uVar13;
  abctime aVar14;
  timespec ts;
  timespec local_40;
  
  pGVar5 = (Ga2_Man_t *)calloc(1,0xe0);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    aVar14 = -1;
  }
  else {
    aVar14 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pGVar5->timeStart = aVar14;
  pGVar5->fUseNewLine = 1;
  pGVar5->pGia = pGia;
  pGVar5->pPars = pPars;
  iVar2 = Ga2_ManMarkup(pGia,5,pPars->fUseSimple);
  pGVar5->nMarked = iVar2;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  pGVar5->vCnfs = pVVar6;
  pvVar8 = calloc(1,0x10);
  *ppvVar7 = pvVar8;
  pvVar8 = calloc(1,0x10);
  pVVar6->nSize = 2;
  ppvVar7[1] = pvVar8;
  iVar2 = pGia->nObjs;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar3 = iVar2;
  }
  pVVar9->nCap = iVar3;
  if (iVar3 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = iVar2;
  }
  else {
    piVar10 = (int *)malloc((long)iVar3 << 2);
    pVVar9->pArray = piVar10;
    pVVar9->nSize = iVar2;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0xff,(long)iVar2 << 2);
      goto LAB_00603c66;
    }
  }
  piVar10 = (int *)0x0;
LAB_00603c66:
  pGVar5->vIds = pVVar9;
  pVVar9 = (Vec_Int_t *)calloc(1,0x10);
  pGVar5->vProofIds = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  piVar11 = (int *)malloc(4000);
  pVVar9->pArray = piVar11;
  pGVar5->vAbs = pVVar9;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar11 = (int *)malloc(4000);
  p->pArray = piVar11;
  pGVar5->vValues = p;
  if (iVar2 < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  *piVar10 = 0;
  Vec_IntPush(p,0);
  Vec_IntPush(pVVar9,0);
  pRVar12 = Rnm_ManStart(pGia);
  pGVar5->pRnm = pRVar12;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  pGVar5->vId2Lit = pVVar6;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar9->pArray = piVar10;
  pGVar5->vLits = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar9->pArray = piVar10;
  pGVar5->vIsopMem = pVVar9;
  Cnf_ReadMsops(&pGVar5->pSopSizes,&pGVar5->pSops);
  uVar13 = 0x3ffff;
  while( true ) {
    do {
      uVar1 = uVar13 + 1;
      uVar4 = uVar13 & 1;
      uVar13 = uVar1;
    } while (uVar4 != 0);
    if (uVar1 < 9) break;
    iVar2 = 5;
    while (uVar1 % (iVar2 - 2U) != 0) {
      uVar4 = iVar2 * iVar2;
      iVar2 = iVar2 + 2;
      if (uVar1 < uVar4) goto LAB_00603db5;
    }
  }
LAB_00603db5:
  pGVar5->nTable = uVar1;
  piVar10 = (int *)calloc((long)(int)(uVar1 * 6),4);
  pGVar5->pTable = piVar10;
  return pGVar5;
}

Assistant:

Ga2_Man_t * Ga2_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Ga2_Man_t * p;
    p = ABC_CALLOC( Ga2_Man_t, 1 );
    p->timeStart = Abc_Clock();
    p->fUseNewLine = 1;
    // user data
    p->pGia      = pGia;
    p->pPars     = pPars;
    // markings 
    p->nMarked   = Ga2_ManMarkup( pGia, 5, pPars->fUseSimple );
    p->vCnfs     = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    // abstraction
    p->vIds      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vProofIds = Vec_IntAlloc( 0 );
    p->vAbs      = Vec_IntAlloc( 1000 );
    p->vValues   = Vec_IntAlloc( 1000 );
    // add constant node to abstraction
    Ga2_ObjSetId( p, Gia_ManConst0(pGia), 0 );
    Vec_IntPush( p->vValues, 0 );
    Vec_IntPush( p->vAbs, 0 );
    // refinement
    p->pRnm      = Rnm_ManStart( pGia );
//    p->pRf2      = Rf2_ManStart( pGia );
    // SAT solver and variables
    p->vId2Lit   = Vec_PtrAlloc( 1000 );
    // temporaries
    p->vLits     = Vec_IntAlloc( 100 );
    p->vIsopMem  = Vec_IntAlloc( 100 );
    Cnf_ReadMsops( &p->pSopSizes, &p->pSops );
    // hash table
    p->nTable = Abc_PrimeCudd(1<<18);
    p->pTable = ABC_CALLOC( int, 6 * p->nTable ); 
    return p;
}